

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O1

void Tim_ManIncrementTravId(Tim_Man_t *p)

{
  int iVar1;
  Tim_Obj_t *pTVar2;
  long lVar3;
  
  if (0x3ffffffe < p->nTravIds) {
    p->nTravIds = 0;
    iVar1 = p->nCis;
    if (0 < (long)iVar1) {
      pTVar2 = p->pCis;
      lVar3 = 0;
      do {
        *(undefined4 *)((long)&pTVar2->TravId + lVar3) = 0;
        lVar3 = lVar3 + 0x18;
      } while ((long)iVar1 * 0x18 != lVar3);
    }
    iVar1 = p->nCos;
    if (0 < (long)iVar1) {
      pTVar2 = p->pCos;
      lVar3 = 0;
      do {
        *(undefined4 *)((long)&pTVar2->TravId + lVar3) = 0;
        lVar3 = lVar3 + 0x18;
      } while ((long)iVar1 * 0x18 != lVar3);
    }
  }
  if (p->nTravIds < 0x3fffffff) {
    p->nTravIds = p->nTravIds + 1;
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)-1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timTrav.c"
                ,0x37,"void Tim_ManIncrementTravId(Tim_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the trav ID of the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManIncrementTravId( Tim_Man_t * p )
{
    int i;
    if ( p->nTravIds >= (1<<30)-1 )
    {
        p->nTravIds = 0;
        for ( i = 0; i < p->nCis; i++ )
            p->pCis[i].TravId = 0;
        for ( i = 0; i < p->nCos; i++ )
            p->pCos[i].TravId = 0;
    }
    assert( p->nTravIds < (1<<30)-1 );
    p->nTravIds++;
}